

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O0

rb_result_t rb_tree_new_ex(rb_tree *tree,rb_cmp_func_ex_t compare,void *state)

{
  rb_result_t ret;
  void *state_local;
  rb_cmp_func_ex_t compare_local;
  rb_tree *tree_local;
  
  if (tree == (rb_tree *)0x0) {
    __assert_fail("\"tree != NULL\" && 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                  ,0x51,"rb_result_t rb_tree_new_ex(struct rb_tree *, rb_cmp_func_ex_t, void *)");
  }
  if (compare == (rb_cmp_func_ex_t)0x0) {
    __assert_fail("\"compare != NULL\" && 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                  ,0x52,"rb_result_t rb_tree_new_ex(struct rb_tree *, rb_cmp_func_ex_t, void *)");
  }
  tree->root = (rb_tree_node *)0x0;
  tree->compare = compare;
  tree->state = state;
  tree->rightmost = (rb_tree_node *)0x0;
  return 0;
}

Assistant:

rb_result_t rb_tree_new_ex(struct rb_tree *tree,
                           rb_cmp_func_ex_t compare,
                           void *state)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(compare != NULL);

    tree->root = NULL;
    tree->compare = compare;
    tree->state = state;
    tree->rightmost = NULL;

    return ret;
}